

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WAsmjsUtils.cpp
# Opt level: O1

void WAsmJs::JitFunctionIfReady(ScriptFunction *func,uint interpretedCount)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  int iVar3;
  FunctionBody *body;
  undefined4 *puVar4;
  undefined4 extraout_var;
  ScriptContext *pSVar5;
  
  body = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)func);
  bVar2 = ShouldJitFunction(body,interpretedCount);
  if (bVar2) {
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)body);
    if ((body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015cd718,AsmjsEntryPointInfoPhase,sourceContextId,
                       ((body->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
                       functionId);
    if (bVar2) {
      iVar3 = (*(body->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(body);
      Output::Print(L"Scheduling %s For Full JIT at callcount:%d\n",CONCAT44(extraout_var,iVar3),
                    (ulong)interpretedCount);
    }
    pSVar5 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)body);
    GenerateFunction(pSVar5->nativeCodeGen,body,func);
    body->field_0x17b = body->field_0x17b | 0x80;
  }
  return;
}

Assistant:

void JitFunctionIfReady(Js::ScriptFunction* func, uint interpretedCount /*= 0*/)
    {
#if ENABLE_NATIVE_CODEGEN
        Js::FunctionBody* body = func->GetFunctionBody();
        if (WAsmJs::ShouldJitFunction(body, interpretedCount))
        {
            if (PHASE_TRACE(Js::AsmjsEntryPointInfoPhase, body))
            {
                Output::Print(_u("Scheduling %s For Full JIT at callcount:%d\n"), body->GetDisplayName(), interpretedCount);
            }
            GenerateFunction(body->GetScriptContext()->GetNativeCodeGenerator(), body, func);
            body->SetIsAsmJsFullJitScheduled(true);
        }
#endif
    }